

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O3

int initiate_socket_connection(SOCKET_IO_INSTANCE *socket_io_instance)

{
  NETWORK_INTERFACE_DESCRIPTION_TAG **ppNVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  LOGGER_LOG p_Var7;
  addrinfo *paVar8;
  NETWORK_INTERFACE_DESCRIPTION *nid;
  char *pcVar9;
  char *__dest;
  int *piVar10;
  int __protocol;
  socklen_t __len;
  char *__src;
  sockaddr *__addr;
  char *pcVar11;
  NETWORK_INTERFACE_DESCRIPTION *pNVar12;
  NETWORK_INTERFACE_DESCRIPTION *nid_00;
  long lVar13;
  NETWORK_INTERFACE_DESCRIPTION_TAG *pNVar14;
  ifreq ifr;
  ifconf ifc;
  ulong in_stack_fffffffffffffae8;
  undefined4 uVar16;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffffaf0;
  undefined4 uVar17;
  char local_4e0 [18];
  byte local_4ce;
  byte local_4cd;
  in_addr local_4cc;
  int local_4b8;
  char *local_4b0;
  undefined1 local_4a6 [18];
  undefined8 local_494;
  undefined8 uStack_48c;
  undefined8 local_484;
  undefined8 uStack_47c;
  undefined8 local_474;
  undefined8 uStack_46c;
  undefined8 local_464;
  undefined8 uStack_45c;
  undefined8 uStack_454;
  undefined4 uStack_44c;
  undefined4 local_448;
  undefined4 uStack_444;
  undefined8 uStack_440;
  char local_438 [1032];
  
  if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
    _Var2 = dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver);
    if (!_Var2) {
      p_Var7 = xlogging_get_log_function();
      iVar3 = 0x20e;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x20e;
      }
      pcVar11 = "DNS did not resolve hostname IP address. Hostname:%s";
      iVar4 = 0x20d;
      goto LAB_0010b294;
    }
    paVar8 = dns_resolver_get_addrInfo(socket_io_instance->dns_resolver);
    if (paVar8 == (addrinfo *)0x0) {
      p_Var7 = xlogging_get_log_function();
      iVar3 = 0x217;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x217;
      }
      pcVar11 = "DNS resolution failed. Hostname:%s";
      iVar4 = 0x216;
      goto LAB_0010b294;
    }
    if (socket_io_instance->address_type != ADDRESS_TYPE_IP) goto LAB_0010b127;
    iVar3 = paVar8->ai_family;
    iVar4 = paVar8->ai_socktype;
    __protocol = paVar8->ai_protocol;
  }
  else {
    pcVar11 = socket_io_instance->hostname;
    if (pcVar11 == (char *)0x0) {
      p_Var7 = xlogging_get_log_function();
      iVar3 = 0x235;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x235;
      }
      pcVar11 = "Hostname is NULL";
      iVar4 = 0x234;
LAB_0010b294:
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                ,"initiate_socket_connection",iVar4,1,pcVar11);
      return iVar3;
    }
    sVar6 = strlen(pcVar11);
    if (sVar6 - 0x6c < 0xffffffffffffff93) {
      p_Var7 = xlogging_get_log_function();
      iVar3 = 0x227;
      if (p_Var7 == (LOGGER_LOG)0x0) {
        return 0x227;
      }
      pcVar11 = "Hostname %s is too long for a unix socket (max len = %lu)";
      iVar4 = 0x226;
      goto LAB_0010b294;
    }
    uStack_444 = 0;
    uStack_440 = 0;
    uStack_454 = 0;
    uStack_44c = 0;
    local_448 = 0;
    local_464 = 0;
    uStack_45c = 0;
    local_474 = 0;
    uStack_46c = 0;
    local_484 = 0;
    uStack_47c = 0;
    local_494 = 0;
    uStack_48c = 0;
    local_4a6[2] = '\0';
    local_4a6[3] = '\0';
    local_4a6[4] = '\0';
    local_4a6[5] = '\0';
    local_4a6[6] = '\0';
    local_4a6[7] = '\0';
    local_4a6[8] = '\0';
    local_4a6[9] = '\0';
    local_4a6._10_8_ = 0;
    local_4a6._0_2_ = 1;
    memcpy(local_4a6 + 2,pcVar11,sVar6);
    paVar8 = (addrinfo *)0x0;
LAB_0010b127:
    iVar3 = 1;
    iVar4 = 1;
    __protocol = 0;
  }
  iVar3 = socket(iVar3,iVar4,__protocol);
  socket_io_instance->socket = iVar3;
  if (iVar3 < 0) {
    p_Var7 = xlogging_get_log_function();
    iVar3 = 0x247;
    if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0010b8e4;
    pcVar11 = "Failure: socket create failure %d.";
    iVar4 = 0x246;
  }
  else {
    pcVar11 = socket_io_instance->target_mac_address;
    if (pcVar11 == (char *)0x0) {
LAB_0010b868:
      uVar5 = fcntl(iVar3,3,0);
      if ((uVar5 == 0xffffffff) ||
         (iVar3 = fcntl(socket_io_instance->socket,4,(ulong)(uVar5 | 0x800)), iVar3 == -1)) {
        p_Var7 = xlogging_get_log_function();
        iVar3 = 0x255;
        if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0010b8e4;
        pcVar11 = "Failure: fcntl failure.";
        iVar4 = 0x254;
      }
      else {
        if (socket_io_instance->address_type == ADDRESS_TYPE_IP) {
          __addr = (sockaddr *)paVar8->ai_addr;
          __len = paVar8->ai_addrlen;
        }
        else {
          __addr = (sockaddr *)local_4a6;
          __len = 0x6e;
        }
        iVar3 = connect(socket_io_instance->socket,__addr,__len);
        if ((iVar3 == 0) || (piVar10 = __errno_location(), *piVar10 == 0x73)) {
          if (socket_io_instance->on_io_open_complete == (ON_IO_OPEN_COMPLETE)0x0) {
            return 0;
          }
          (*socket_io_instance->on_io_open_complete)
                    (socket_io_instance->on_io_open_complete_context,IO_OPEN_OK);
          return 0;
        }
        p_Var7 = xlogging_get_log_function();
        iVar3 = 0x265;
        if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0010b8e4;
        pcVar11 = "Failure: connect failure %d.";
        iVar4 = 0x264;
      }
    }
    else {
      local_4b8 = 0x400;
      local_4b0 = local_438;
      iVar4 = ioctl(iVar3,0x8912);
      uVar16 = (undefined4)(in_stack_fffffffffffffae8 >> 0x20);
      if (iVar4 == -1) {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          piVar10 = __errno_location();
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"get_network_interface_descriptions",0x198,1,
                    "ioctl failed querying socket (SIOCGIFCONF, errno=%d)",CONCAT44(uVar16,*piVar10)
                   );
        }
LAB_0010b779:
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"set_target_network_interface",0x1db,1,
                    "Failed getting network interface descriptions");
        }
      }
      else {
        if ((ulong)(long)local_4b8 < 0x28) {
          nid_00 = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
        }
        else {
          lVar13 = ((ulong)(long)local_4b8 / 0x28) * 0x28;
          nid_00 = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
          __src = local_4b0;
          pNVar12 = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
          do {
            uVar17 = (undefined4)((ulong)in_stack_fffffffffffffaf0 >> 0x20);
            uVar16 = (undefined4)(in_stack_fffffffffffffae8 >> 0x20);
            strcpy(local_4e0,__src);
            iVar4 = ioctl(iVar3,0x8913,local_4e0);
            if (iVar4 != 0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                piVar10 = __errno_location();
                uVar15 = CONCAT44(uVar16,*piVar10);
                pcVar11 = "ioctl failed querying socket (SIOCGIFFLAGS, errno=%d)";
                iVar3 = 0x1ab;
LAB_0010b580:
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"get_network_interface_descriptions",iVar3,1,pcVar11,uVar15);
              }
LAB_0010b771:
              destroy_network_interface_descriptions(nid_00);
              goto LAB_0010b779;
            }
            iVar4 = ioctl(iVar3,0x8927,local_4e0);
            if (iVar4 != 0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                piVar10 = __errno_location();
                uVar15 = CONCAT44(uVar16,*piVar10);
                pcVar11 = "ioctl failed querying socket (SIOCGIFHWADDR, errno=%d)";
                iVar3 = 0x1b1;
                goto LAB_0010b580;
              }
              goto LAB_0010b771;
            }
            iVar4 = ioctl(iVar3,0x8915,local_4e0);
            if (iVar4 != 0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                piVar10 = __errno_location();
                uVar15 = CONCAT44(uVar16,*piVar10);
                pcVar11 = "ioctl failed querying socket (SIOCGIFADDR, errno=%d)";
                iVar3 = 0x1b7;
                goto LAB_0010b580;
              }
              goto LAB_0010b771;
            }
            nid = (NETWORK_INTERFACE_DESCRIPTION *)malloc(0x20);
            if (nid == (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"create_network_interface_description",0x147,1,
                          "Failed allocating NETWORK_INTERFACE_DESCRIPTION");
              }
LAB_0010b73d:
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"get_network_interface_descriptions",0x1bd,1,
                          "Failed creating network interface description");
              }
              goto LAB_0010b771;
            }
            sVar6 = strlen(local_4e0);
            sVar6 = sVar6 + 1;
            if (sVar6 == 0) {
              sVar6 = 0xffffffffffffffff;
            }
            if (sVar6 == 0xffffffffffffffff) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar11 = "invalid malloc size";
                iVar3 = 0x14b;
LAB_0010b68a:
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"create_network_interface_description",iVar3,1,pcVar11);
              }
LAB_0010b695:
              destroy_network_interface_descriptions(nid);
              goto LAB_0010b73d;
            }
            pcVar9 = (char *)malloc(sVar6);
            nid->name = pcVar9;
            if (pcVar9 == (char *)0x0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar11 = "failed setting interface description name (malloc failed)";
                iVar3 = 0x151;
                goto LAB_0010b68a;
              }
              goto LAB_0010b695;
            }
            strcpy(pcVar9,local_4e0);
            pcVar9 = (char *)malloc(0x12);
            nid->mac_address = pcVar9;
            if (pcVar9 == (char *)0x0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar11 = "failed formatting mac address (malloc failed) size:%zu";
                iVar3 = 0x160;
                goto LAB_0010b68a;
              }
              goto LAB_0010b695;
            }
            in_stack_fffffffffffffaf0 = CONCAT44(uVar17,local_4cc.s_addr >> 0x18);
            in_stack_fffffffffffffae8 =
                 CONCAT44(uVar16,local_4cc.s_addr >> 0x10) & 0xffffffff000000ff;
            iVar4 = sprintf(pcVar9,"%02X:%02X:%02X:%02X:%02X:%02X",(ulong)local_4ce,(ulong)local_4cd
                            ,(ulong)(byte)local_4cc.s_addr,(ulong)local_4cc.s_addr._1_1_,
                            in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0);
            if (iVar4 < 1) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar11 = "failed formatting mac address (sprintf failed)";
                iVar3 = 0x166;
                goto LAB_0010b68a;
              }
              goto LAB_0010b695;
            }
            pcVar9 = inet_ntoa(local_4cc);
            if (pcVar9 == (char *)0x0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar11 = "failed setting the ip address (inet_ntoa failed)";
                iVar3 = 0x16c;
LAB_0010b725:
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"create_network_interface_description",iVar3,1,pcVar11);
              }
LAB_0010b730:
              destroy_network_interface_descriptions(nid);
              goto LAB_0010b73d;
            }
            sVar6 = strlen(pcVar9);
            sVar6 = sVar6 + 1;
            if (sVar6 == 0) {
              sVar6 = 0xffffffffffffffff;
            }
            if (sVar6 == 0xffffffffffffffff) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar11 = "invalid malloc size";
                iVar3 = 0x172;
                goto LAB_0010b725;
              }
              goto LAB_0010b730;
            }
            __dest = (char *)malloc(sVar6);
            nid->ip_address = __dest;
            if (__dest == (char *)0x0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar11 = "failed setting the ip address (malloc failed)";
                iVar3 = 0x178;
                goto LAB_0010b725;
              }
              goto LAB_0010b730;
            }
            strcpy(__dest,pcVar9);
            nid->next = (NETWORK_INTERFACE_DESCRIPTION_TAG *)0x0;
            if (pNVar12 != (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
              pNVar12->next = nid;
            }
            if (nid_00 == (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
              nid_00 = nid;
            }
            __src = __src + 0x28;
            lVar13 = lVar13 + -0x28;
            pNVar12 = nid;
            pNVar14 = nid_00;
          } while (lVar13 != 0);
          do {
            iVar4 = strcmp(pcVar11,pNVar14->mac_address);
            uVar16 = (undefined4)(in_stack_fffffffffffffae8 >> 0x20);
            if (iVar4 == 0) {
              pcVar11 = pNVar14->name;
              sVar6 = strlen(pcVar11);
              iVar3 = setsockopt(iVar3,1,0x19,pcVar11,(socklen_t)sVar6);
              if (iVar3 != 0) {
                p_Var7 = xlogging_get_log_function();
                if (p_Var7 != (LOGGER_LOG)0x0) {
                  piVar10 = __errno_location();
                  (*p_Var7)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                            ,"set_target_network_interface",499,1,"setsockopt failed (%d)",
                            CONCAT44(uVar16,*piVar10));
                }
                goto LAB_0010b1d5;
              }
              destroy_network_interface_descriptions(nid_00);
              iVar3 = socket_io_instance->socket;
              goto LAB_0010b868;
            }
            ppNVar1 = &pNVar14->next;
            pNVar14 = *ppNVar1;
          } while (*ppNVar1 != (NETWORK_INTERFACE_DESCRIPTION_TAG *)0x0);
        }
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"set_target_network_interface",0x1ee,1,
                    "Did not find a network interface matching MAC ADDRESS");
        }
LAB_0010b1d5:
        destroy_network_interface_descriptions(nid_00);
      }
      p_Var7 = xlogging_get_log_function();
      iVar3 = 0x24e;
      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0010b8e4;
      pcVar11 = "Failure: failed selecting target network interface (MACADDR=%s).";
      iVar4 = 0x24d;
    }
  }
  (*p_Var7)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
            ,"initiate_socket_connection",iVar4,1,pcVar11);
LAB_0010b8e4:
  if (-1 < socket_io_instance->socket) {
    close(socket_io_instance->socket);
  }
  socket_io_instance->socket = -1;
  return iVar3;
}

Assistant:

static int initiate_socket_connection(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result;
    int flags;
    struct addrinfo* addr = NULL;
    struct sockaddr_un addrInfoUn;

    if(socket_io_instance->address_type == ADDRESS_TYPE_IP)
    {
        if(!dns_resolver_is_lookup_complete(socket_io_instance->dns_resolver))
        {
            LogError("DNS did not resolve hostname IP address. Hostname:%s", socket_io_instance->hostname);
            result = MU_FAILURE;
        }
        else
        {
            addr = dns_resolver_get_addrInfo(socket_io_instance->dns_resolver);

            if (addr == NULL)
            {
                LogError("DNS resolution failed. Hostname:%s", socket_io_instance->hostname);
                result = MU_FAILURE;
            } 
            else 
            {
                result = 0;
            }
        }
    }
    else
    {
        if (socket_io_instance->hostname != NULL)
        {
            size_t hostname_len = strlen(socket_io_instance->hostname);
            if (hostname_len + 1 > sizeof(addrInfoUn.sun_path))
            {
                LogError("Hostname %s is too long for a unix socket (max len = %lu)", socket_io_instance->hostname, (unsigned long)sizeof(addrInfoUn.sun_path));
                result = MU_FAILURE;
            }
            else
            {
                memset(&addrInfoUn, 0, sizeof(addrInfoUn));
                addrInfoUn.sun_family = AF_UNIX;
                // No need to add NULL terminator due to the above memset
                (void)memcpy(addrInfoUn.sun_path, socket_io_instance->hostname, hostname_len);
                result = 0;
            }
        }
        else
        {
            LogError("Hostname is NULL");
            result = MU_FAILURE;
        }
    }

    if(result == 0)
    {
        if (socket_io_instance->address_type == ADDRESS_TYPE_IP)
        {
            socket_io_instance->socket = socket(addr->ai_family, addr->ai_socktype, addr->ai_protocol);
        }
        else
        {
            socket_io_instance->socket = socket(AF_UNIX, SOCK_STREAM, 0);
        }

        if (socket_io_instance->socket < SOCKET_SUCCESS)
        {
            LogError("Failure: socket create failure %d.", socket_io_instance->socket);
            result = MU_FAILURE;
        }
        #ifndef __APPLE__
        else if (socket_io_instance->target_mac_address != NULL &&
                    set_target_network_interface(socket_io_instance->socket, socket_io_instance->target_mac_address) != 0)
        {
            LogError("Failure: failed selecting target network interface (MACADDR=%s).", socket_io_instance->target_mac_address);
            result = MU_FAILURE;
        }
        #endif //__APPLE__
        else if ((-1 == (flags = fcntl(socket_io_instance->socket, F_GETFL, 0))) ||
            (fcntl(socket_io_instance->socket, F_SETFL, flags | O_NONBLOCK) == -1))
        {
            LogError("Failure: fcntl failure.");
            result = MU_FAILURE;
        }
        else
        {
            if (socket_io_instance->address_type == ADDRESS_TYPE_IP)
            {
                result = connect(socket_io_instance->socket, addr->ai_addr, addr->ai_addrlen);
            }
            else
            {
                result = connect(socket_io_instance->socket, (struct sockaddr *)&addrInfoUn, sizeof(addrInfoUn));
            }

            if ((result != 0) && (errno != EINPROGRESS))
            {
                LogError("Failure: connect failure %d.", errno);
                result = MU_FAILURE;
            }
            else  // result == 0 || errno == EINPROGRESS
            {
                // Async connect will return -1.
                result = 0;
                if (socket_io_instance->on_io_open_complete != NULL)
                {
                    socket_io_instance->on_io_open_complete(socket_io_instance->on_io_open_complete_context, IO_OPEN_OK /*: IO_OPEN_ERROR*/);
                }
            }
        }

        if (result != 0)
        {
            if (socket_io_instance->socket >= SOCKET_SUCCESS)
            {
                close(socket_io_instance->socket);
            }
            socket_io_instance->socket = INVALID_SOCKET;
        }
    }

    return result;
}